

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac_prng.c
# Opt level: O0

void update(TCHmacPrng_t prng,uint8_t *e,uint len)

{
  undefined1 local_1e;
  undefined1 local_1d;
  uint local_1c;
  uint8_t separator1;
  uint8_t separator0;
  uint8_t *puStack_18;
  uint len_local;
  uint8_t *e_local;
  TCHmacPrng_t prng_local;
  
  local_1d = 0;
  local_1e = 1;
  local_1c = len;
  puStack_18 = e;
  e_local = (uint8_t *)prng;
  tc_hmac_init(&prng->h);
  tc_hmac_update((TCHmacState_t)e_local,e_local + 0x110,0x20);
  tc_hmac_update((TCHmacState_t)e_local,&local_1d,1);
  tc_hmac_update((TCHmacState_t)e_local,puStack_18,local_1c);
  tc_hmac_final(e_local + 0xf0,0x20,(TCHmacState_t)e_local);
  tc_hmac_set_key((TCHmacState_t)e_local,e_local + 0xf0,0x20);
  tc_hmac_init((TCHmacState_t)e_local);
  tc_hmac_update((TCHmacState_t)e_local,e_local + 0x110,0x20);
  tc_hmac_final(e_local + 0x110,0x20,(TCHmacState_t)e_local);
  tc_hmac_init((TCHmacState_t)e_local);
  tc_hmac_update((TCHmacState_t)e_local,e_local + 0x110,0x20);
  tc_hmac_update((TCHmacState_t)e_local,&local_1e,1);
  tc_hmac_update((TCHmacState_t)e_local,puStack_18,local_1c);
  tc_hmac_final(e_local + 0xf0,0x20,(TCHmacState_t)e_local);
  tc_hmac_set_key((TCHmacState_t)e_local,e_local + 0xf0,0x20);
  tc_hmac_init((TCHmacState_t)e_local);
  tc_hmac_update((TCHmacState_t)e_local,e_local + 0x110,0x20);
  tc_hmac_final(e_local + 0x110,0x20,(TCHmacState_t)e_local);
  return;
}

Assistant:

static void update(TCHmacPrng_t prng, const uint8_t *e, unsigned int len)
{
	const uint8_t separator0 = 0x00;
	const uint8_t separator1 = 0x01;

	/* use current state, e and separator 0 to compute a new prng key: */
	(void)tc_hmac_init(&prng->h);
	(void)tc_hmac_update(&prng->h, prng->v, sizeof(prng->v));
	(void)tc_hmac_update(&prng->h, &separator0, sizeof(separator0));
	(void)tc_hmac_update(&prng->h, e, len);
	(void)tc_hmac_final(prng->key, sizeof(prng->key), &prng->h);
	/* configure the new prng key into the prng's instance of hmac */
	(void)tc_hmac_set_key(&prng->h, prng->key, sizeof(prng->key));

	/* use the new key to compute a new state variable v */
	(void)tc_hmac_init(&prng->h);
	(void)tc_hmac_update(&prng->h, prng->v, sizeof(prng->v));
	(void)tc_hmac_final(prng->v, sizeof(prng->v), &prng->h);

	/* use current state, e and separator 1 to compute a new prng key: */
	(void)tc_hmac_init(&prng->h);
	(void)tc_hmac_update(&prng->h, prng->v, sizeof(prng->v));
	(void)tc_hmac_update(&prng->h, &separator1, sizeof(separator1));
	(void)tc_hmac_update(&prng->h, e, len);
	(void)tc_hmac_final(prng->key, sizeof(prng->key), &prng->h);
	/* configure the new prng key into the prng's instance of hmac */
	(void)tc_hmac_set_key(&prng->h, prng->key, sizeof(prng->key));

	/* use the new key to compute a new state variable v */
	(void)tc_hmac_init(&prng->h);
	(void)tc_hmac_update(&prng->h, prng->v, sizeof(prng->v));
	(void)tc_hmac_final(prng->v, sizeof(prng->v), &prng->h);
}